

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status fdb_get_kvs_seqnum(fdb_kvs_handle *handle,fdb_seqnum_t *seqnum)

{
  bool bVar1;
  fdb_seqnum_t fVar2;
  fdb_seqnum_t *in_RSI;
  fdb_kvs_handle *in_RDI;
  filemgr *file;
  fdb_kvs_handle *in_stack_00000088;
  undefined6 in_stack_ffffffffffffffd8;
  uint8_t in_stack_ffffffffffffffde;
  uint8_t in_stack_ffffffffffffffdf;
  filemgr *in_stack_ffffffffffffffe0;
  fdb_status local_4;
  
  if (in_RDI == (fdb_kvs_handle *)0x0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RSI == (fdb_seqnum_t *)0x0) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    bVar1 = atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_ffffffffffffffe0,
                               in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde);
    if (bVar1) {
      if (in_RDI->shandle == (snap_handle *)0x0) {
        fdb_check_file_reopen(in_RDI,(file_status_t *)0x0);
        fdb_sync_db_header(in_stack_00000088);
        in_stack_ffffffffffffffe0 = in_RDI->file;
        if ((in_RDI->kvs == (kvs_info *)0x0) || (in_RDI->kvs->id == 0)) {
          filemgr_mutex_lock((filemgr *)0x1623b5);
          fVar2 = filemgr_get_seqnum((filemgr *)0x1623bf);
          *in_RSI = fVar2;
          filemgr_mutex_unlock((filemgr *)0x1623d4);
        }
        else {
          fVar2 = fdb_kvs_get_seqnum((filemgr *)
                                     CONCAT17(in_stack_ffffffffffffffdf,
                                              CONCAT16(in_stack_ffffffffffffffde,
                                                       in_stack_ffffffffffffffd8)),0x1623ed);
          *in_RSI = fVar2;
        }
      }
      else {
        *in_RSI = in_RDI->max_seqnum;
      }
      atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_ffffffffffffffe0,
                         in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde);
      local_4 = FDB_RESULT_SUCCESS;
    }
    else {
      local_4 = FDB_RESULT_HANDLE_BUSY;
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_kvs_seqnum(fdb_kvs_handle *handle, fdb_seqnum_t *seqnum)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!seqnum) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (handle->shandle) {
        // handle for snapshot
        // return MAX_SEQNUM instead of the file's sequence number
        *seqnum = handle->max_seqnum;
    } else {
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);

        struct filemgr *file;
        file = handle->file;

        if (handle->kvs == NULL ||
            handle->kvs->id == 0) {
            filemgr_mutex_lock(file);
            *seqnum = filemgr_get_seqnum(file);
            filemgr_mutex_unlock(file);
        } else {
            *seqnum = fdb_kvs_get_seqnum(file, handle->kvs->id);
        }
    }
    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}